

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O0

void __thiscall
testing::internal::ParameterizedTestCaseRegistry::~ParameterizedTestCaseRegistry
          (ParameterizedTestCaseRegistry *this)

{
  bool bVar1;
  reference ppPVar2;
  __normal_iterator<testing::internal::ParameterizedTestCaseInfoBase_**,_std::vector<testing::internal::ParameterizedTestCaseInfoBase_*,_std::allocator<testing::internal::ParameterizedTestCaseInfoBase_*>_>_>
  local_20;
  __normal_iterator<testing::internal::ParameterizedTestCaseInfoBase_**,_std::vector<testing::internal::ParameterizedTestCaseInfoBase_*,_std::allocator<testing::internal::ParameterizedTestCaseInfoBase_*>_>_>
  local_18;
  iterator it;
  ParameterizedTestCaseRegistry *this_local;
  
  it._M_current = (ParameterizedTestCaseInfoBase **)this;
  local_18._M_current =
       (ParameterizedTestCaseInfoBase **)
       std::
       vector<testing::internal::ParameterizedTestCaseInfoBase_*,_std::allocator<testing::internal::ParameterizedTestCaseInfoBase_*>_>
       ::begin(&this->test_case_infos_);
  while( true ) {
    local_20._M_current =
         (ParameterizedTestCaseInfoBase **)
         std::
         vector<testing::internal::ParameterizedTestCaseInfoBase_*,_std::allocator<testing::internal::ParameterizedTestCaseInfoBase_*>_>
         ::end(&this->test_case_infos_);
    bVar1 = __gnu_cxx::operator!=(&local_18,&local_20);
    if (!bVar1) break;
    ppPVar2 = __gnu_cxx::
              __normal_iterator<testing::internal::ParameterizedTestCaseInfoBase_**,_std::vector<testing::internal::ParameterizedTestCaseInfoBase_*,_std::allocator<testing::internal::ParameterizedTestCaseInfoBase_*>_>_>
              ::operator*(&local_18);
    if (*ppPVar2 != (ParameterizedTestCaseInfoBase *)0x0) {
      (**(code **)(*(long *)*ppPVar2 + 8))();
    }
    __gnu_cxx::
    __normal_iterator<testing::internal::ParameterizedTestCaseInfoBase_**,_std::vector<testing::internal::ParameterizedTestCaseInfoBase_*,_std::allocator<testing::internal::ParameterizedTestCaseInfoBase_*>_>_>
    ::operator++(&local_18);
  }
  std::
  vector<testing::internal::ParameterizedTestCaseInfoBase_*,_std::allocator<testing::internal::ParameterizedTestCaseInfoBase_*>_>
  ::~vector(&this->test_case_infos_);
  return;
}

Assistant:

~ParameterizedTestCaseRegistry() {
    for (TestCaseInfoContainer::iterator it = test_case_infos_.begin();
         it != test_case_infos_.end(); ++it) {
      delete *it;
    }
  }